

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O2

bool __thiscall
ExpressionFunctionHandler::addUserFunction
          (ExpressionFunctionHandler *this,Identifier *name,
          vector<Identifier,_std::allocator<Identifier>_> *parameters,
          vector<Token,_std::allocator<Token>_> *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _func_void *p_Var3;
  anon_class_80_3_66625fa0 executor;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  
  std::__cxx11::string::string((string *)&executor,(string *)name);
  std::vector<Identifier,_std::allocator<Identifier>_>::vector(&executor.parameterNames,parameters);
  std::vector<Token,_std::allocator<Token>_>::vector(&executor.content,content);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x50);
  *(_func_void **)p_Var3 = p_Var3 + 0x10;
  paVar1 = &executor.functionName._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)executor.functionName._name._M_dataplus._M_p == paVar1) {
    *(long *)(p_Var3 + 0x10) =
         CONCAT71(executor.functionName._name.field_2._M_allocated_capacity._1_7_,
                  executor.functionName._name.field_2._M_local_buf[0]);
    *(undefined8 *)(p_Var3 + 0x18) = executor.functionName._name.field_2._8_8_;
  }
  else {
    *(pointer *)p_Var3 = executor.functionName._name._M_dataplus._M_p;
    *(long *)(p_Var3 + 0x10) =
         CONCAT71(executor.functionName._name.field_2._M_allocated_capacity._1_7_,
                  executor.functionName._name.field_2._M_local_buf[0]);
  }
  *(size_type *)(p_Var3 + 8) = executor.functionName._name._M_string_length;
  executor.functionName._name._M_string_length = 0;
  executor.functionName._name.field_2._M_local_buf[0] = '\0';
  *(pointer *)(p_Var3 + 0x20) =
       executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(p_Var3 + 0x28) =
       executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(p_Var3 + 0x30) =
       executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  executor.functionName._name._M_dataplus._M_p = (pointer)paVar1;
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)(p_Var3 + 0x38),&executor.content);
  pcStack_50 = std::
               _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:117:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:117:18)>
             ::_M_manager;
  local_48 = (long)(parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 5;
  local_38 = 0;
  local_68._M_unused._0_8_ = p_Var3;
  local_40 = local_48;
  bVar2 = registerEntry(this,name,(Entry *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  addUserFunction(Identifier_const&,std::vector<Identifier,std::allocator<Identifier>>const&,std::vector<Token,std::allocator<Token>>const&)
  ::$_0::~__0((__0 *)&executor);
  return bVar2;
}

Assistant:

bool ExpressionFunctionHandler::addUserFunction(const Identifier &name, const std::vector<Identifier> &parameters, const std::vector<Token> &content)
{
	// Executor: Evaluate parameters and instantiate function content with parameter substitutions
	auto executor = [functionName=name, parameterNames=parameters, content](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", functionName, i+1);
				return result;
			}

			params.push_back(result);
		}

		// instantiate
		TokenStreamTokenizer tok;
		tok.init(content);

		for (size_t i = 0; i < parameters.size(); ++i)
		{
			const auto &paramName = parameterNames[i];
			const auto &paramValue = params[i];

			switch (paramValue.type)
			{
			case ExpressionValueType::Float:
				tok.registerReplacementFloat(paramName, paramValue.floatValue);
				break;
			case ExpressionValueType::String:
				tok.registerReplacementString(paramName, paramValue.strValue.string());
				break;
			case ExpressionValueType::Integer:
				tok.registerReplacementInteger(paramName, paramValue.intValue);
				break;
			case ExpressionValueType::Invalid: // will not occur, invalid results are caught above
				break;
			}
		}

		Expression result = parseExpression(tok, false);
		if (!result.isLoaded())
		{
			Logger::queueError(Logger::Error, "%s: Failed to parse user function expression", functionName);
			return {};
		}

		if (!tok.atEnd())
		{
			Logger::queueError(Logger::Error, "%s: Unconsumed tokens after parsing user function expresion", functionName);
			return {};
		}

		// evaluate expression
		return result.evaluate();
	};

	return registerEntry(name, Entry{std::move(executor), parameters.size(), parameters.size(), ExpFuncSafety::Unsafe});
}